

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O0

bool anon_unknown.dwarf_accb::CheckAccessTwoSyscalls(uintptr_t addr,int pagesize)

{
  long lVar1;
  undefined1 local_28 [4];
  int rv;
  uintptr_t old [1];
  int pagesize_local;
  uintptr_t addr_local;
  
  if ((addr & 0xfffffffffffffff0) == 0) {
    addr_local._7_1_ = false;
  }
  else {
    old[0]._4_4_ = pagesize;
    lVar1 = syscall(0xe,0,addr & 0xfffffffffffffff0,local_28,8);
    if ((int)lVar1 == 0) {
      syscall(0xe,2,local_28,0,8);
      addr_local._7_1_ = true;
    }
    else {
      addr_local._7_1_ = false;
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool CheckAccessTwoSyscalls(uintptr_t addr, int pagesize) {
  addr &= ~uintptr_t{15};

  if (addr == 0) {
    return false;
  }

  uintptr_t old[(kKernelSigSetSize + sizeof(uintptr_t) - 1) / sizeof(uintptr_t)];
  int rv = syscall(SYS_rt_sigprocmask, SIG_BLOCK, addr, old, kKernelSigSetSize);
  if (rv  == 0) {
    syscall(SYS_rt_sigprocmask, SIG_SETMASK, old, nullptr, kKernelSigSetSize);
    return true;
  }
  return false;
}